

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChElementBeamANCF_3243.cpp
# Opt level: O2

ChVector<double> * __thiscall
chrono::fea::ChElementBeamANCF_3243::ComputeTangent
          (ChVector<double> *__return_storage_ptr__,ChElementBeamANCF_3243 *this,double xi)

{
  ChVector<double> BeamAxisTangent;
  VectorN Sxi_xi_compact;
  Matrix3xN e_bar;
  Matrix3xN *local_1a8;
  VectorN *local_1a0;
  ChVector<double> local_198;
  VectorN local_180;
  Matrix3xN local_140;
  
  Calc_Sxi_xi_compact(this,&local_180,xi,0.0,0.0);
  CalcCoordMatrix(this,&local_140);
  local_1a8 = &local_140;
  local_1a0 = &local_180;
  ChVector<double>::
  ChVector<Eigen::Product<Eigen::Matrix<double,3,8,1,3,8>,Eigen::Matrix<double,8,1,0,8,1>,0>>
            (&local_198,
             (MatrixBase<Eigen::Product<Eigen::Matrix<double,_3,_8,_1,_3,_8>,_Eigen::Matrix<double,_8,_1,_0,_8,_1>,_0>_>
              *)&local_1a8,(type *)0x0);
  ChVector<double>::GetNormalized(__return_storage_ptr__,&local_198);
  return __return_storage_ptr__;
}

Assistant:

ChVector<> ChElementBeamANCF_3243::ComputeTangent(const double xi) {
    VectorN Sxi_xi_compact;
    Calc_Sxi_xi_compact(Sxi_xi_compact, xi, 0, 0);

    Matrix3xN e_bar;
    CalcCoordMatrix(e_bar);

    // partial derivative of the position vector with respect to xi (normalized coordinate along the beam axis).  In
    // general, this will not be a unit vector
    ChVector<double> BeamAxisTangent = e_bar * Sxi_xi_compact;

    return BeamAxisTangent.GetNormalized();
}